

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O1

void costly_tin(char *verb)

{
  boolean bVar1;
  char *pcVar2;
  
  if ((tin.tin)->where != '\x03') {
    bVar1 = costly_spot((tin.tin)->ox,(tin.tin)->oy);
    if ((bVar1 != '\0') && (((tin.tin)->field_0x4a & 8) == 0)) goto LAB_001953b6;
  }
  if (((tin.tin)->field_0x4a & 4) == 0) {
    return;
  }
LAB_001953b6:
  pcVar2 = "open";
  if (verb != (char *)0x0) {
    pcVar2 = verb;
  }
  verbalize("You %s it, you bought it!",pcVar2);
  if (1 < (tin.tin)->quan) {
    tin.tin = splitobj(tin.tin,1);
  }
  bill_dummy_object(tin.tin);
  return;
}

Assistant:

static void costly_tin(
    const char *verb /* if 0, the verb is "open" */)
{
	if (((!carried(tin.tin) &&
	     costly_spot(tin.tin->ox, tin.tin->oy) &&
	     !tin.tin->no_charge)
	    || tin.tin->unpaid)) {
	    verbalize("You %s it, you bought it!", verb ? verb : "open");
	    if (tin.tin->quan > 1L) tin.tin = splitobj(tin.tin, 1L);
	    bill_dummy_object(tin.tin);
	}
}